

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::lts_20250127::Mutex::ReaderLock(Mutex *this)

{
  GraphId id;
  ulong uVar1;
  ulong uVar2;
  SynchLocksHeld *held_locks;
  bool bVar3;
  
  id = DebugOnlyDeadlockCheck(this);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  do {
    if ((uVar1 & 0x1c) != 0) {
      ReaderLock(this);
      break;
    }
    LOCK();
    uVar2 = (this->mu_).super___atomic_base<long>._M_i;
    bVar3 = uVar1 == uVar2;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = (uVar1 | 1) + 0x100;
      uVar2 = uVar1;
    }
    UNLOCK();
    uVar1 = uVar2;
  } while (!bVar3);
  if (_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 == 0) {
    return;
  }
  held_locks = Synch_GetAllLocks();
  LockEnter(this,id,held_locks);
  return;
}

Assistant:

void Mutex::ReaderLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_read_lock);
  GraphId id = DebugOnlyDeadlockCheck(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  for (;;) {
    // If there are non-readers holding the lock, use the slow loop.
    if (ABSL_PREDICT_FALSE(v & (kMuWriter | kMuWait | kMuEvent)) != 0) {
      this->LockSlow(kShared, nullptr, 0);
      break;
    }
    // We can avoid the loop and only use the CAS when the lock is free or
    // only held by readers.
    if (ABSL_PREDICT_TRUE(mu_.compare_exchange_weak(
            v, (kMuReader | v) + kMuOne, std::memory_order_acquire,
            std::memory_order_relaxed))) {
      break;
    }
  }
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_read_lock, 0);
}